

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O0

int ffgphd(fitsfile *fptr,int maxdim,int *simple,int *bitpix,int *naxis,LONGLONG *naxes,long *pcount
          ,long *gcount,int *extend,double *bscale,double *bzero,LONGLONG *blank,int *nspace,
          int *status)

{
  int iVar1;
  undefined4 *in_RCX;
  undefined4 *in_RDX;
  int in_ESI;
  int *in_RDI;
  undefined4 *in_R8;
  long in_R9;
  char xtension [71];
  char comm [73];
  char value [71];
  char name [75];
  char card [81];
  char keyword [75];
  char message [81];
  LONGLONG axislen;
  long longnaxis;
  long longbitpix;
  int namelen;
  int nextkey;
  int ii;
  int tstatus;
  int found_end;
  int unknown;
  int *in_stack_fffffffffffffd48;
  undefined4 in_stack_fffffffffffffd50;
  int in_stack_fffffffffffffd54;
  fitsfile *in_stack_fffffffffffffd58;
  undefined4 in_stack_fffffffffffffd60;
  int in_stack_fffffffffffffd64;
  fitsfile *in_stack_fffffffffffffd68;
  int *in_stack_fffffffffffffd70;
  int *in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd80;
  int in_stack_fffffffffffffd84;
  char *in_stack_fffffffffffffd88;
  int *in_stack_fffffffffffffda8;
  long *in_stack_fffffffffffffdb0;
  int *in_stack_fffffffffffffdb8;
  int in_stack_fffffffffffffdc4;
  fitsfile *in_stack_fffffffffffffdc8;
  int *in_stack_fffffffffffffdd0;
  char *in_stack_fffffffffffffdd8;
  char *in_stack_fffffffffffffde0;
  char in_stack_fffffffffffffde8;
  undefined7 in_stack_fffffffffffffde9;
  int *in_stack_fffffffffffffdf0;
  char *in_stack_fffffffffffffdf8;
  int *in_stack_fffffffffffffe10;
  int *in_stack_fffffffffffffe18;
  double *in_stack_fffffffffffffe20;
  char *in_stack_fffffffffffffe28;
  int in_stack_fffffffffffffe34;
  fitsfile *in_stack_fffffffffffffe38;
  char local_178;
  int *in_stack_fffffffffffffe98;
  long *in_stack_fffffffffffffea0;
  char *in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeb4;
  fitsfile *in_stack_fffffffffffffeb8;
  char local_c8 [96];
  undefined8 local_68;
  long local_60;
  long local_58;
  uint local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  long local_38;
  undefined4 *local_30;
  undefined4 *local_28;
  undefined4 *local_20;
  int local_14;
  int *local_10;
  
  if (0 < *stack0x00000040) {
    return *stack0x00000040;
  }
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_14 = in_ESI;
  local_10 = in_RDI;
  if (*in_RDI != *(int *)(*(long *)(in_RDI + 2) + 0x54)) {
    ffmahd(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc4,in_stack_fffffffffffffdb8,
           (int *)in_stack_fffffffffffffdb0);
  }
  if (local_20 != (undefined4 *)0x0) {
    *local_20 = 1;
  }
  local_3c = 0;
  ffgkyn(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
         (char *)in_stack_fffffffffffffe20,(char *)in_stack_fffffffffffffe18,
         in_stack_fffffffffffffe10);
  if (*(int *)(*(long *)(local_10 + 2) + 0x54) == 0) {
    iVar1 = strcmp(&stack0xfffffffffffffe38,"SIMPLE");
    if (iVar1 != 0) {
      snprintf(local_c8,0x51,"First keyword of the file is not SIMPLE: %s",&stack0xfffffffffffffe38)
      ;
      ffpmsg((char *)0x1d6a53);
      *stack0x00000040 = 0xdd;
      return 0xdd;
    }
    if (in_stack_fffffffffffffde8 == 'F') {
      if (local_20 != (undefined4 *)0x0) {
        *local_20 = 0;
      }
    }
    else if (in_stack_fffffffffffffde8 != 'T') {
      *stack0x00000040 = 0xdc;
      return 0xdc;
    }
  }
  else {
    iVar1 = strcmp(&stack0xfffffffffffffe38,"XTENSION");
    if (iVar1 != 0) {
      snprintf(local_c8,0x51,"First keyword of the extension is not XTENSION: %s",
               &stack0xfffffffffffffe38);
      ffpmsg((char *)0x1d6b81);
      *stack0x00000040 = 0xe1;
      return 0xe1;
    }
    iVar1 = ffc2s((char *)in_stack_fffffffffffffd68,
                  (char *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                  &in_stack_fffffffffffffd58->HDUposition);
    if (0 < iVar1) {
      ffpmsg((char *)0x1d6abc);
      ffpmsg((char *)0x1d6ac9);
      return *stack0x00000040;
    }
    if ((in_stack_fffffffffffffde8 != '\'') ||
       ((iVar1 = strcmp(&stack0xfffffffffffffd48,"IMAGE"), iVar1 != 0 &&
        (iVar1 = strcmp(&stack0xfffffffffffffd48,"IUEIMAGE"), iVar1 != 0)))) {
      local_3c = 1;
      snprintf(local_c8,0x51,"This is not an IMAGE extension: %s",&stack0xfffffffffffffde8);
      ffpmsg((char *)0x1d6b4f);
    }
  }
  if ((local_3c == 0) || (*(int *)(*(long *)(local_10 + 2) + 0x47c) == 0)) {
    ffgkyn(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
           (char *)in_stack_fffffffffffffe20,(char *)in_stack_fffffffffffffe18,
           in_stack_fffffffffffffe10);
    iVar1 = strcmp(&stack0xfffffffffffffe38,"BITPIX");
    if (iVar1 != 0) {
      snprintf(local_c8,0x51,"Second keyword of the extension is not BITPIX: %s",
               &stack0xfffffffffffffe38);
      ffpmsg((char *)0x1d6d7f);
      *stack0x00000040 = 0xde;
      return 0xde;
    }
    iVar1 = ffc2ii((char *)in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0,
                   in_stack_fffffffffffffda8);
    if (0 < iVar1) {
      snprintf(local_c8,0x51,"Value of BITPIX keyword is not an integer: %s",
               &stack0xfffffffffffffde8);
      ffpmsg((char *)0x1d6def);
      *stack0x00000040 = 0xd3;
      return 0xd3;
    }
    if (((((local_58 != 8) && (local_58 != 0x10)) && (local_58 != 0x20)) &&
        ((local_58 != 0x40 && (local_58 != -0x20)))) && (local_58 != -0x40)) {
      snprintf(local_c8,0x51,"Illegal value for BITPIX keyword: %s",&stack0xfffffffffffffde8);
      ffpmsg((char *)0x1d6e83);
      *stack0x00000040 = 0xd3;
      return 0xd3;
    }
    if (local_28 != (undefined4 *)0x0) {
      *local_28 = (int)local_58;
    }
    ffgtkn(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb4,in_stack_fffffffffffffea8,
           in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    if (*stack0x00000040 == 0xd0) {
      *stack0x00000040 = 0xdf;
      return 0xdf;
    }
    if ((*stack0x00000040 == 0xd1) || (999 < local_60)) {
      snprintf(local_c8,0x51,"NAXIS = %ld is illegal",local_60);
      ffpmsg((char *)0x1d6f67);
      *stack0x00000040 = 0xd4;
      return 0xd4;
    }
    if (local_30 != (undefined4 *)0x0) {
      *local_30 = (int)local_60;
    }
    local_4c = 4;
    for (local_48 = 0; local_48 < local_60; local_48 = local_48 + 1) {
      ffkeyn(in_stack_fffffffffffffd88,in_stack_fffffffffffffd84,(char *)in_stack_fffffffffffffd78,
             in_stack_fffffffffffffd70);
      ffgtknjj(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb4,in_stack_fffffffffffffea8,
               in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      if (*stack0x00000040 == 0xd0) {
        *stack0x00000040 = 0xe0;
        return 0xe0;
      }
      if (*stack0x00000040 == 0xd1) {
        *stack0x00000040 = 0xd5;
        return 0xd5;
      }
      if ((local_48 < local_14) && (local_38 != 0)) {
        *(undefined8 *)(local_38 + (long)local_48 * 8) = local_68;
      }
      local_4c = local_4c + 1;
    }
  }
  else {
    local_3c = 0;
    ffxmsg(in_stack_fffffffffffffd64,(char *)in_stack_fffffffffffffd58);
    if ((local_28 != (undefined4 *)0x0) &&
       (ffgidt(in_stack_fffffffffffffd58,
               (int *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
               in_stack_fffffffffffffd48), 0 < *stack0x00000040)) {
      ffpmsg((char *)0x1d6c26);
      return *stack0x00000040;
    }
    if ((local_30 != (undefined4 *)0x0) &&
       (ffgidm(in_stack_fffffffffffffd58,
               (int *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
               in_stack_fffffffffffffd48), 0 < *stack0x00000040)) {
      ffpmsg((char *)0x1d6c7f);
      return *stack0x00000040;
    }
    if ((local_38 != 0) &&
       (ffgiszll(in_stack_fffffffffffffd68,in_stack_fffffffffffffd64,
                 (LONGLONG *)in_stack_fffffffffffffd58,
                 (int *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50)),
       0 < *stack0x00000040)) {
      ffpmsg((char *)0x1d6cdf);
      return *stack0x00000040;
    }
    local_4c = 9;
  }
  if (xtension._32_8_ != 0) {
    *(undefined8 *)xtension._32_8_ = 0x3ff0000000000000;
  }
  if (xtension._40_8_ != 0) {
    *(undefined8 *)xtension._40_8_ = 0;
  }
  if (xtension._8_8_ != 0) {
    *(undefined8 *)xtension._8_8_ = 0;
  }
  if (xtension._16_8_ != 0) {
    *(undefined8 *)xtension._16_8_ = 1;
  }
  if (xtension._24_8_ != 0) {
    *(undefined4 *)xtension._24_8_ = 0;
  }
  if (xtension._48_8_ != 0) {
    *(undefined8 *)xtension._48_8_ = 0x4995cdd1;
  }
  *(undefined4 *)xtension._56_8_ = 0;
  local_40 = 0;
  local_44 = *stack0x00000040;
  while( true ) {
    if (local_40 != 0) {
      if (local_3c != 0) {
        *stack0x00000040 = 0xe9;
      }
      return *stack0x00000040;
    }
    iVar1 = ffgrec(in_stack_fffffffffffffd58,in_stack_fffffffffffffd54,
                   (char *)in_stack_fffffffffffffd48,(int *)0x1d71f1);
    if (iVar1 < 1) {
      ffgknm(in_stack_fffffffffffffd88,
             (char *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
             in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
      iVar1 = fftrec(in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
      if (0 < iVar1) {
        snprintf(local_c8,0x51,"Name of keyword no. %d contains illegal character(s): %s",
                 (ulong)local_4c,&stack0xfffffffffffffe38);
        ffpmsg((char *)0x1d72ab);
        if ((int)local_4c % 0x24 == 0) {
          ffpmsg((char *)0x1d72cb);
        }
      }
      iVar1 = strcmp(&stack0xfffffffffffffe38,"BSCALE");
      if ((iVar1 == 0) && (xtension._32_8_ != 0)) {
        *(undefined4 *)xtension._56_8_ = 0;
        ffpsvc((char *)CONCAT71(in_stack_fffffffffffffde9,in_stack_fffffffffffffde8),
               in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
        iVar1 = ffc2dd(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,in_stack_fffffffffffffe18
                      );
        if (0 < iVar1) {
          *stack0x00000040 = local_44;
          *(undefined8 *)xtension._32_8_ = 0x3ff0000000000000;
          snprintf(local_c8,0x51,"Error reading BSCALE keyword value as a double: %s",
                   &stack0xfffffffffffffde8);
          ffpmsg((char *)0x1d73a0);
        }
      }
      else {
        iVar1 = strcmp(&stack0xfffffffffffffe38,"BZERO");
        if ((iVar1 == 0) && (xtension._40_8_ != 0)) {
          *(undefined4 *)xtension._56_8_ = 0;
          ffpsvc((char *)CONCAT71(in_stack_fffffffffffffde9,in_stack_fffffffffffffde8),
                 in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
          iVar1 = ffc2dd(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
                         in_stack_fffffffffffffe18);
          if (0 < iVar1) {
            *stack0x00000040 = local_44;
            *(undefined8 *)xtension._40_8_ = 0;
            snprintf(local_c8,0x51,"Error reading BZERO keyword value as a double: %s",
                     &stack0xfffffffffffffde8);
            ffpmsg((char *)0x1d7473);
          }
        }
        else {
          iVar1 = strcmp(&stack0xfffffffffffffe38,"BLANK");
          if ((iVar1 == 0) && (xtension._48_8_ != 0)) {
            *(undefined4 *)xtension._56_8_ = 0;
            ffpsvc((char *)CONCAT71(in_stack_fffffffffffffde9,in_stack_fffffffffffffde8),
                   in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
            iVar1 = ffc2jj((char *)in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0,
                           in_stack_fffffffffffffda8);
            if (0 < iVar1) {
              *stack0x00000040 = local_44;
              *(undefined8 *)xtension._48_8_ = 0x4995cdd1;
              snprintf(local_c8,0x51,"Error reading BLANK keyword value as an integer: %s",
                       &stack0xfffffffffffffde8);
              ffpmsg((char *)0x1d7546);
            }
          }
          else {
            iVar1 = strcmp(&stack0xfffffffffffffe38,"PCOUNT");
            if ((iVar1 == 0) && (xtension._8_8_ != 0)) {
              *(undefined4 *)xtension._56_8_ = 0;
              ffpsvc((char *)CONCAT71(in_stack_fffffffffffffde9,in_stack_fffffffffffffde8),
                     in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
              iVar1 = ffc2ii((char *)in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0,
                             in_stack_fffffffffffffda8);
              if (0 < iVar1) {
                snprintf(local_c8,0x51,"Error reading PCOUNT keyword value as an integer: %s",
                         &stack0xfffffffffffffde8);
                ffpmsg((char *)0x1d75f9);
              }
            }
            else {
              iVar1 = strcmp(&stack0xfffffffffffffe38,"GCOUNT");
              if ((iVar1 == 0) && (xtension._16_8_ != 0)) {
                *(undefined4 *)xtension._56_8_ = 0;
                ffpsvc((char *)CONCAT71(in_stack_fffffffffffffde9,in_stack_fffffffffffffde8),
                       in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0
                      );
                iVar1 = ffc2ii((char *)in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0,
                               in_stack_fffffffffffffda8);
                if (0 < iVar1) {
                  snprintf(local_c8,0x51,"Error reading GCOUNT keyword value as an integer: %s",
                           &stack0xfffffffffffffde8);
                  ffpmsg((char *)0x1d76ac);
                }
              }
              else {
                iVar1 = strcmp(&stack0xfffffffffffffe38,"EXTEND");
                if ((iVar1 == 0) && (xtension._24_8_ != 0)) {
                  *(undefined4 *)xtension._56_8_ = 0;
                  ffpsvc((char *)CONCAT71(in_stack_fffffffffffffde9,in_stack_fffffffffffffde8),
                         in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                         in_stack_fffffffffffffdd0);
                  iVar1 = ffc2ll(&stack0xfffffffffffffde8,(int *)xtension._24_8_,stack0x00000040);
                  if (0 < iVar1) {
                    *stack0x00000040 = local_44;
                    *(undefined4 *)xtension._24_8_ = 0;
                    snprintf(local_c8,0x51,"Error reading EXTEND keyword value as a logical: %s",
                             &stack0xfffffffffffffde8);
                    ffpmsg((char *)0x1d777e);
                  }
                }
                else {
                  iVar1 = strcmp(&stack0xfffffffffffffe38,"END");
                  if (iVar1 == 0) {
                    local_40 = 1;
                  }
                  else if (local_178 == '\0') {
                    *(int *)xtension._56_8_ = *(int *)xtension._56_8_ + 1;
                  }
                  else {
                    *(undefined4 *)xtension._56_8_ = 0;
                  }
                }
              }
            }
          }
        }
      }
    }
    else if (*stack0x00000040 == 0xcb) {
      local_40 = 1;
      *stack0x00000040 = local_44;
    }
    else {
      ffpmsg((char *)0x1d7230);
    }
    if (0 < *stack0x00000040) break;
    local_4c = local_4c + 1;
  }
  if (*(int *)(*(long *)(local_10 + 2) + 0x54) == 0) {
    ffpmsg((char *)0x1d7812);
  }
  else {
    ffpmsg((char *)0x1d7820);
  }
  return *stack0x00000040;
}

Assistant:

int ffgphd(fitsfile *fptr,  /* I - FITS file pointer                        */
           int maxdim,      /* I - maximum no. of dimensions to read;       */
           int *simple,     /* O - does file conform to FITS standard? 1/0  */
           int *bitpix,     /* O - number of bits per data value pixel      */
           int *naxis,      /* O - number of axes in the data array         */
           LONGLONG naxes[],    /* O - length of each data axis                 */
           long *pcount,    /* O - number of group parameters (usually 0)   */
           long *gcount,    /* O - number of random groups (usually 1 or 0) */
           int *extend,     /* O - may FITS file haave extensions?          */
           double *bscale,  /* O - array pixel linear scaling factor        */
           double *bzero,   /* O - array pixel linear scaling zero point    */
           LONGLONG *blank, /* O - value used to represent undefined pixels */
           int *nspace,     /* O - number of blank keywords prior to END    */
           int *status)     /* IO - error status                            */
{
/*
  Get the Primary HeaDer parameters.  Check that the keywords conform to
  the FITS standard and return the parameters which determine the size and
  structure of the primary array or IMAGE extension.
*/
    int unknown, found_end, tstatus, ii, nextkey, namelen;
    long longbitpix, longnaxis;
    LONGLONG axislen;
    char message[FLEN_ERRMSG], keyword[FLEN_KEYWORD];
    char card[FLEN_CARD];
    char name[FLEN_KEYWORD], value[FLEN_VALUE], comm[FLEN_COMMENT];
    char xtension[FLEN_VALUE];

    if (*status > 0)
        return(*status);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    if (simple)
       *simple = 1;

    unknown = 0;

    /*--------------------------------------------------------------------*/
    /*  Get 1st keyword of HDU and test whether it is SIMPLE or XTENSION  */
    /*--------------------------------------------------------------------*/
    ffgkyn(fptr, 1, name, value, comm, status);

    if ((fptr->Fptr)->curhdu == 0) /* Is this the beginning of the FITS file? */
    {
        if (!strcmp(name, "SIMPLE"))
        {
            if (value[0] == 'F')
            {
                if (simple)
                    *simple=0;          /* not a simple FITS file */
            }
            else if (value[0] != 'T')
                return(*status = BAD_SIMPLE);
        }

        else
        {
            snprintf(message, FLEN_ERRMSG,
                   "First keyword of the file is not SIMPLE: %s", name);
            ffpmsg(message);
            return(*status = NO_SIMPLE);
        }
    }

    else    /* not beginning of the file, so presumably an IMAGE extension */
    {       /* or it could be a compressed image in a binary table */

        if (!strcmp(name, "XTENSION"))
        {
            if (ffc2s(value, xtension, status) > 0)  /* get the value string */
            {
                ffpmsg("Bad value string for XTENSION keyword:");
                ffpmsg(value);
                return(*status);
            }

            /* allow the quoted string value to begin in any column and */
            /* allow any number of trailing blanks before the closing quote */
            if ( (value[0] != '\'')   ||  /* first char must be a quote */
                  ( strcmp(xtension, "IMAGE")  &&
                    strcmp(xtension, "IUEIMAGE") ) )
            {
                unknown = 1;  /* unknown type of extension; press on anyway */
                snprintf(message, FLEN_ERRMSG,
                   "This is not an IMAGE extension: %s", value);
                ffpmsg(message);
            }
        }

        else  /* error: 1st keyword of extension != XTENSION */
        {
            snprintf(message, FLEN_ERRMSG,
            "First keyword of the extension is not XTENSION: %s", name);
            ffpmsg(message);
            return(*status = NO_XTENSION);
        }
    }

    if (unknown && (fptr->Fptr)->compressimg)
    {
        /* this is a compressed image, so read ZBITPIX, ZNAXIS keywords */
        unknown = 0;  /* reset flag */
        ffxmsg(3, message); /* clear previous spurious error message */

        if (bitpix)
        {
            ffgidt(fptr, bitpix, status); /* get bitpix value */

            if (*status > 0)
            {
                ffpmsg("Error reading BITPIX value of compressed image");
                return(*status);
            }
        }

        if (naxis)
        {
            ffgidm(fptr, naxis, status); /* get NAXIS value */

            if (*status > 0)
            {
                ffpmsg("Error reading NAXIS value of compressed image");
                return(*status);
            }
        }

        if (naxes)
        {
            ffgiszll(fptr, maxdim, naxes, status);  /* get NAXISn value */

            if (*status > 0)
            {
                ffpmsg("Error reading NAXISn values of compressed image");
                return(*status);
            }
        }

        nextkey = 9; /* skip required table keywords in the following search */
    }
    else
    {

        /*----------------------------------------------------------------*/
        /*  Get 2nd keyword;  test whether it is BITPIX with legal value  */
        /*----------------------------------------------------------------*/
        ffgkyn(fptr, 2, name, value, comm, status);  /* BITPIX = 2nd keyword */

        if (strcmp(name, "BITPIX"))
        {
            snprintf(message, FLEN_ERRMSG,
            "Second keyword of the extension is not BITPIX: %s", name);
            ffpmsg(message);
            return(*status = NO_BITPIX);
        }

        if (ffc2ii(value,  &longbitpix, status) > 0)
        {
            snprintf(message, FLEN_ERRMSG,
            "Value of BITPIX keyword is not an integer: %s", value);
            ffpmsg(message);
            return(*status = BAD_BITPIX);
        }
        else if (longbitpix != BYTE_IMG && longbitpix != SHORT_IMG &&
             longbitpix != LONG_IMG && longbitpix != LONGLONG_IMG &&
             longbitpix != FLOAT_IMG && longbitpix != DOUBLE_IMG)
        {
            snprintf(message, FLEN_ERRMSG,
            "Illegal value for BITPIX keyword: %s", value);
            ffpmsg(message);
            return(*status = BAD_BITPIX);
        }
        if (bitpix)
            *bitpix = longbitpix;  /* do explicit type conversion */

        /*---------------------------------------------------------------*/
        /*  Get 3rd keyword;  test whether it is NAXIS with legal value  */
        /*---------------------------------------------------------------*/
        ffgtkn(fptr, 3, "NAXIS",  &longnaxis, status);

        if (*status == BAD_ORDER)
            return(*status = NO_NAXIS);
        else if (*status == NOT_POS_INT || longnaxis > 999)
        {
            snprintf(message,FLEN_ERRMSG,"NAXIS = %ld is illegal", longnaxis);
            ffpmsg(message);
            return(*status = BAD_NAXIS);
        }
        else
            if (naxis)
                 *naxis = longnaxis;  /* do explicit type conversion */

        /*---------------------------------------------------------*/
        /*  Get the next NAXISn keywords and test for legal values */
        /*---------------------------------------------------------*/
        for (ii=0, nextkey=4; ii < longnaxis; ii++, nextkey++)
        {
            ffkeyn("NAXIS", ii+1, keyword, status);
            ffgtknjj(fptr, 4+ii, keyword, &axislen, status);

            if (*status == BAD_ORDER)
                return(*status = NO_NAXES);
            else if (*status == NOT_POS_INT)
                return(*status = BAD_NAXES);
            else if (ii < maxdim)
                if (naxes)
                    naxes[ii] = axislen;
        }
    }

    /*---------------------------------------------------------*/
    /*  now look for other keywords of interest:               */
    /*  BSCALE, BZERO, BLANK, PCOUNT, GCOUNT, EXTEND, and END  */
    /*---------------------------------------------------------*/

    /*  initialize default values in case keyword is not present */
    if (bscale)
        *bscale = 1.0;
    if (bzero)
        *bzero  = 0.0;
    if (pcount)
        *pcount = 0;
    if (gcount)
        *gcount = 1;
    if (extend)
        *extend = 0;
    if (blank)
      *blank = NULL_UNDEFINED; /* no default null value for BITPIX=8,16,32 */

    *nspace = 0;
    found_end = 0;
    tstatus = *status;

    for (; !found_end; nextkey++)  
    {
      /* get next keyword */
      /* don't use ffgkyn here because it trys to parse the card to read */
      /* the value string, thus failing to read the file just because of */
      /* minor syntax errors in optional keywords.                       */

      if (ffgrec(fptr, nextkey, card, status) > 0 )  /* get the 80-byte card */
      {
        if (*status == KEY_OUT_BOUNDS)
        {
          found_end = 1;  /* simply hit the end of the header */
          *status = tstatus;  /* reset error status */
        }
        else          
        {
          ffpmsg("Failed to find the END keyword in header (ffgphd).");
        }
      }
      else /* got the next keyword without error */
      {
        ffgknm(card, name, &namelen, status); /* get the keyword name */

        if (fftrec(name, status) > 0)  /* test keyword name; catches no END */
        {
          snprintf(message, FLEN_ERRMSG,
              "Name of keyword no. %d contains illegal character(s): %s",
              nextkey, name);
          ffpmsg(message);

          if (nextkey % 36 == 0) /* test if at beginning of 36-card record */
            ffpmsg("  (This may indicate a missing END keyword).");
        }

        if (!strcmp(name, "BSCALE") && bscale)
        {
            *nspace = 0;  /* reset count of blank keywords */
            ffpsvc(card, value, comm, status); /* parse value and comment */

            if (ffc2dd(value, bscale, status) > 0) /* convert to double */
            {
                /* reset error status and continue, but still issue warning */
                *status = tstatus;
                *bscale = 1.0;

                snprintf(message, FLEN_ERRMSG,
                "Error reading BSCALE keyword value as a double: %s", value);
                ffpmsg(message);
            }
        }

        else if (!strcmp(name, "BZERO") && bzero)
        {
            *nspace = 0;  /* reset count of blank keywords */
            ffpsvc(card, value, comm, status); /* parse value and comment */

            if (ffc2dd(value, bzero, status) > 0) /* convert to double */
            {
                /* reset error status and continue, but still issue warning */
                *status = tstatus;
                *bzero = 0.0;

                snprintf(message, FLEN_ERRMSG,
                "Error reading BZERO keyword value as a double: %s", value);
                ffpmsg(message);
            }
        }

        else if (!strcmp(name, "BLANK") && blank)
        {
            *nspace = 0;  /* reset count of blank keywords */
            ffpsvc(card, value, comm, status); /* parse value and comment */

            if (ffc2jj(value, blank, status) > 0) /* convert to LONGLONG */
            {
                /* reset error status and continue, but still issue warning */
                *status = tstatus;
                *blank = NULL_UNDEFINED;

                snprintf(message, FLEN_ERRMSG,
                "Error reading BLANK keyword value as an integer: %s", value);
                ffpmsg(message);
            }
        }

        else if (!strcmp(name, "PCOUNT") && pcount)
        {
            *nspace = 0;  /* reset count of blank keywords */
            ffpsvc(card, value, comm, status); /* parse value and comment */

            if (ffc2ii(value, pcount, status) > 0) /* convert to long */
            {
                snprintf(message, FLEN_ERRMSG,
                "Error reading PCOUNT keyword value as an integer: %s", value);
                ffpmsg(message);
            }
        }

        else if (!strcmp(name, "GCOUNT") && gcount)
        {
            *nspace = 0;  /* reset count of blank keywords */
            ffpsvc(card, value, comm, status); /* parse value and comment */

            if (ffc2ii(value, gcount, status) > 0) /* convert to long */
            {
                snprintf(message, FLEN_ERRMSG,
                "Error reading GCOUNT keyword value as an integer: %s", value);
                ffpmsg(message);
            }
        }

        else if (!strcmp(name, "EXTEND") && extend)
        {
            *nspace = 0;  /* reset count of blank keywords */
            ffpsvc(card, value, comm, status); /* parse value and comment */

            if (ffc2ll(value, extend, status) > 0) /* convert to logical */
            {
                /* reset error status and continue, but still issue warning */
                *status = tstatus;
                *extend = 0;

                snprintf(message, FLEN_ERRMSG,
                "Error reading EXTEND keyword value as a logical: %s", value);
                ffpmsg(message);
            }
        }

        else if (!strcmp(name, "END"))
            found_end = 1;

        else if (!card[0] )
            *nspace = *nspace + 1;  /* this is a blank card in the header */

        else
            *nspace = 0;  /* reset count of blank keywords immediately
                            before the END keyword to zero   */
      }

      if (*status > 0)  /* exit on error after writing error message */
      {
        if ((fptr->Fptr)->curhdu == 0)
            ffpmsg(
            "Failed to read the required primary array header keywords.");
        else
            ffpmsg(
            "Failed to read the required image extension header keywords.");

        return(*status);
      }
    }

    if (unknown)
       *status = NOT_IMAGE;

    return(*status);
}